

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInterval.cpp
# Opt level: O0

void anon_unknown.dwarf_5b268::testComparators<double>(char *type)

{
  bool bVar1;
  ostream *poVar2;
  char *in_RDI;
  Interval<double> b2;
  Interval<double> b1_2;
  Interval<double> b0_2;
  double p3;
  double p2;
  double p1_1;
  double p0_1;
  Interval<double> b1_1;
  Interval<double> b0_1;
  double p1;
  double p0;
  Interval<double> b1;
  Interval<double> b0;
  Rand32 rand;
  unsigned_long in_stack_ffffffffffffff48;
  Rand32 *in_stack_ffffffffffffff50;
  Interval<double> local_a0;
  Interval<double> local_90;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  Interval<double> local_60;
  Interval<double> local_50;
  double local_40;
  double local_38;
  Interval<double> local_30;
  Interval<double> local_20;
  char *local_8;
  
  local_8 = in_RDI;
  poVar2 = std::operator<<((ostream *)&std::cout,"    comparators for type ");
  poVar2 = std::operator<<(poVar2,local_8);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Rand32::Rand32(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  Imath_3_2::Interval<double>::Interval((Interval<double> *)0x16de0f);
  Imath_3_2::Interval<double>::Interval((Interval<double> *)0x16de1c);
  bVar1 = Imath_3_2::Interval<double>::operator==(&local_20,&local_30);
  if (!bVar1) {
    __assert_fail("b0 == b1",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x11b,"void (anonymous namespace)::testComparators(const char *) [T = double]");
  }
  bVar1 = Imath_3_2::Interval<double>::operator!=(&local_20,&local_30);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!(b0 != b1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x11c,"void (anonymous namespace)::testComparators(const char *) [T = double]");
  }
  local_38 = -1.0;
  local_40 = 1.0;
  Imath_3_2::Interval<double>::Interval((Interval<double> *)0x16debf);
  Imath_3_2::Interval<double>::Interval(&local_60,&local_38,&local_40);
  bVar1 = Imath_3_2::Interval<double>::operator==(&local_50,&local_60);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!(b0 == b1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x128,"void (anonymous namespace)::testComparators(const char *) [T = double]");
  }
  bVar1 = Imath_3_2::Interval<double>::operator!=(&local_50,&local_60);
  if (!bVar1) {
    __assert_fail("b0 != b1",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x129,"void (anonymous namespace)::testComparators(const char *) [T = double]");
  }
  local_68 = -1.0;
  local_70 = 1.0;
  local_78 = -2.0;
  local_80 = 2.0;
  Imath_3_2::Interval<double>::Interval(&local_90,&local_68,&local_70);
  Imath_3_2::Interval<double>::Interval(&local_a0,&local_78,&local_80);
  Imath_3_2::Interval<double>::Interval
            ((Interval<double> *)&stack0xffffffffffffff50,&local_68,&local_70);
  bVar1 = Imath_3_2::Interval<double>::operator!=(&local_90,&local_a0);
  if (!bVar1) {
    __assert_fail("b0 != b1",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x13a,"void (anonymous namespace)::testComparators(const char *) [T = double]");
  }
  bVar1 = Imath_3_2::Interval<double>::operator==(&local_90,&local_a0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!(b0 == b1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x13b,"void (anonymous namespace)::testComparators(const char *) [T = double]");
  }
  bVar1 = Imath_3_2::Interval<double>::operator==
                    (&local_90,(Interval<double> *)&stack0xffffffffffffff50);
  if (!bVar1) {
    __assert_fail("b0 == b2",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x13d,"void (anonymous namespace)::testComparators(const char *) [T = double]");
  }
  bVar1 = Imath_3_2::Interval<double>::operator!=
                    (&local_90,(Interval<double> *)&stack0xffffffffffffff50);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!(b0 != b2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x13e,"void (anonymous namespace)::testComparators(const char *) [T = double]");
  }
  return;
}

Assistant:

void
testComparators (const char* type)
{
    cout << "    comparators for type " << type << endl;

    IMATH_INTERNAL_NAMESPACE::Rand32 rand (0);

    //
    // Compare empty.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Interval<T> b0;
        IMATH_INTERNAL_NAMESPACE::Interval<T> b1;

        assert (b0 == b1);
        assert (!(b0 != b1));
    }

    //
    // Compare empty to non-empty.
    //
    {
        T p0 (-1);
        T p1 (1);

        IMATH_INTERNAL_NAMESPACE::Interval<T> b0;
        IMATH_INTERNAL_NAMESPACE::Interval<T> b1 (p0, p1);
        assert (!(b0 == b1));
        assert (b0 != b1);
    }

    //
    // Compare two non-empty
    //
    {
        T p0 (-1);
        T p1 (1);

        T p2 (-2);
        T p3 (2);

        IMATH_INTERNAL_NAMESPACE::Interval<T> b0 (p0, p1);
        IMATH_INTERNAL_NAMESPACE::Interval<T> b1 (p2, p3);
        IMATH_INTERNAL_NAMESPACE::Interval<T> b2 (p0, p1);

        assert (b0 != b1);
        assert (!(b0 == b1));

        assert (b0 == b2);
        assert (!(b0 != b2));
    }
}